

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *pos1,ChVector<double> *dir1
          ,ChVector<double> *pos2,bool auto_distance,double distance)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  element_type *peVar27;
  double dVar28;
  bool bVar29;
  int iVar30;
  int iVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar32;
  ChBodyFrame *pCVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  undefined1 auVar71 [16];
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  double local_48;
  double local_40;
  double local_38;
  
  peVar27 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar33 = &peVar27->super_ChBodyFrame;
  if (peVar27 == (element_type *)0x0) {
    pCVar33 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar33;
  peVar27 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar32 = &peVar27->super_ChBodyFrame;
  if (peVar27 == (element_type *)0x0) {
    pCVar32 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar32;
  iVar30 = (*(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar30),
             (ChVariables *)CONCAT44(extraout_var_00,iVar31));
  iVar30 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar30),
             (ChVariables *)CONCAT44(extraout_var_02,iVar31));
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    local_48 = pos1->m_data[0];
    local_40 = pos1->m_data[1];
    local_38 = pos1->m_data[2];
    dVar69 = pos2->m_data[0];
    dVar70 = pos2->m_data[1];
    dVar72 = pos2->m_data[2];
    dVar36 = dir1->m_data[0];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar36;
    dVar1 = dir1->m_data[1];
    dVar2 = dir1->m_data[2];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar1 * dVar1;
    auVar39 = vfmadd231sd_fma(auVar39,auVar54,auVar54);
    auVar39 = vfmadd231sd_fma(auVar39,auVar66,auVar66);
    if (auVar39._0_8_ < 0.0) {
      dVar37 = sqrt(auVar39._0_8_);
    }
    else {
      auVar39 = vsqrtsd_avx(auVar39,auVar39);
      dVar37 = auVar39._0_8_;
    }
    bVar29 = 2.2250738585072014e-308 <= dVar37;
    dVar37 = 1.0 / dVar37;
    dVar28 = (double)((ulong)bVar29 * (long)(dVar1 * dVar37));
    auVar34._0_8_ = (ulong)bVar29 * (long)(dVar36 * dVar37) + (ulong)!bVar29 * 0x3ff0000000000000;
    auVar34._8_8_ = 0;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = (ulong)bVar29 * (long)(dVar2 * dVar37);
    pCVar33 = (this->super_ChLink).Body1;
    pCVar32 = (this->super_ChLink).Body2;
    dVar36 = local_38 -
             (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
    dVar1 = local_48 -
            (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    dVar2 = local_40 -
            (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar1;
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         dVar2 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar39 = vfmadd231sd_fma(auVar61,auVar48,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar36;
    auVar39 = vfmadd231sd_fma(auVar39,auVar41,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         dVar2 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar54 = vfmadd231sd_fma(auVar67,auVar48,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar54 = vfmadd231sd_fma(auVar54,auVar41,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar1;
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         dVar2 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar66 = vfmadd231sd_fma(auVar56,auVar49,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar36;
    auVar66 = vfmadd231sd_fma(auVar66,auVar42,auVar14);
    (this->m_pos1).m_data[0] = auVar66._0_8_;
    (this->m_pos1).m_data[1] = auVar54._0_8_;
    (this->m_pos1).m_data[2] = auVar39._0_8_;
    dVar36 = dVar72 - (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [2];
    dVar1 = dVar69 - (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                     [0];
    dVar2 = dVar70 - (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                     [1];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar1;
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         dVar2 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar39 = vfmadd231sd_fma(auVar62,auVar50,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar36;
    auVar39 = vfmadd231sd_fma(auVar39,auVar43,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar68._8_8_ = 0;
    auVar68._0_8_ =
         dVar2 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar54 = vfmadd231sd_fma(auVar68,auVar50,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar54 = vfmadd231sd_fma(auVar54,auVar43,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar1;
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         dVar2 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar66 = vfmadd231sd_fma(auVar57,auVar51,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar36;
    auVar66 = vfmadd231sd_fma(auVar66,auVar44,auVar20);
    (this->m_pos2).m_data[0] = auVar66._0_8_;
    (this->m_pos2).m_data[1] = auVar54._0_8_;
    (this->m_pos2).m_data[2] = auVar39._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         dVar28 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar39 = vfmadd231sd_fma(auVar45,auVar34,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar39 = vfmadd231sd_fma(auVar39,auVar35,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         dVar28 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar54 = vfmadd231sd_fma(auVar52,auVar34,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar54 = vfmadd231sd_fma(auVar54,auVar35,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         dVar28 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar66 = vfmadd231sd_fma(auVar58,auVar34,auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar66 = vfmadd231sd_fma(auVar66,auVar35,auVar26);
    (this->m_dir1).m_data[0] = auVar66._0_8_;
    (this->m_dir1).m_data[1] = auVar54._0_8_;
    (this->m_dir1).m_data[2] = auVar39._0_8_;
  }
  else {
    if (&this->m_pos1 != pos1) {
      (this->m_pos1).m_data[0] = pos1->m_data[0];
      (this->m_pos1).m_data[1] = pos1->m_data[1];
      (this->m_pos1).m_data[2] = pos1->m_data[2];
    }
    if (&this->m_pos2 != pos2) {
      (this->m_pos2).m_data[0] = pos2->m_data[0];
      (this->m_pos2).m_data[1] = pos2->m_data[1];
      (this->m_pos2).m_data[2] = pos2->m_data[2];
    }
    dVar69 = dir1->m_data[0];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar69;
    dVar70 = dir1->m_data[1];
    dVar72 = dir1->m_data[2];
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar72;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar70 * dVar70;
    auVar39 = vfmadd231sd_fma(auVar38,auVar53,auVar53);
    auVar39 = vfmadd231sd_fma(auVar39,auVar65,auVar65);
    if (auVar39._0_8_ < 0.0) {
      dVar36 = sqrt(auVar39._0_8_);
    }
    else {
      auVar39 = vsqrtsd_avx(auVar39,auVar39);
      dVar36 = auVar39._0_8_;
    }
    bVar29 = 2.2250738585072014e-308 <= dVar36;
    dVar36 = 1.0 / dVar36;
    (this->m_dir1).m_data[0] =
         (double)((ulong)bVar29 * (long)(dVar69 * dVar36) + (ulong)!bVar29 * 0x3ff0000000000000);
    (this->m_dir1).m_data[1] = (double)((ulong)bVar29 * (long)(dVar70 * dVar36));
    (this->m_dir1).m_data[2] = (double)((ulong)bVar29 * (long)(dVar72 * dVar36));
    pCVar33 = (this->super_ChLink).Body1;
    ChTransform<double>::TransformLocalToParent
              (&this->m_pos1,&(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos
               ,&(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar33 = (this->super_ChLink).Body2;
    ChTransform<double>::TransformLocalToParent
              (&this->m_pos2,&(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos
               ,&(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar33 = (this->super_ChLink).Body1;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (this->m_dir1).m_data[0];
    dVar69 = (this->m_dir1).m_data[1];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         dVar69 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar39 = vfmadd231sd_fma(auVar71,auVar40,auVar3);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = (this->m_dir1).m_data[2];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar34 = vfmadd231sd_fma(auVar39,auVar55,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         dVar69 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar39 = vfmadd231sd_fma(auVar73,auVar40,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar39 = vfmadd231sd_fma(auVar39,auVar55,auVar6);
    dVar28 = auVar39._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         dVar69 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7];
    auVar39 = vfmadd231sd_fma(auVar74,auVar40,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar35 = vfmadd231sd_fma(auVar39,auVar55,auVar8);
    dVar72 = local_38;
    dVar70 = local_40;
    dVar69 = local_48;
  }
  dVar70 = dVar70 - local_40;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar70 * dVar70;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar69 - local_48;
  auVar39 = vfmadd231sd_fma(auVar46,auVar64,auVar64);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar72 - local_38;
  auVar39 = vfmadd231sd_fma(auVar39,auVar60,auVar60);
  if (auVar39._0_8_ < 0.0) {
    dVar36 = sqrt(auVar39._0_8_);
  }
  else {
    auVar39 = vsqrtsd_avx(auVar39,auVar39);
    dVar36 = auVar39._0_8_;
  }
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar72 - local_38;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar69 - local_48;
  this->m_cur_dist = dVar36;
  this->m_dist = (double)((ulong)auto_distance * (long)dVar36 +
                         (ulong)!auto_distance * (long)distance);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar28 * dVar70;
  auVar39 = vfmadd213sd_fma(auVar34,auVar63,auVar47);
  auVar39 = vfmadd213sd_fma(auVar35,auVar59,auVar39);
  this->m_cur_dot = auVar39._0_8_;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         bool local,
                                         const ChVector<>& pos1,
                                         const ChVector<>& dir1,
                                         const ChVector<>& pos2,
                                         bool auto_distance,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> pos1_abs;
    ChVector<> pos2_abs;
    ChVector<> dir1_abs;

    if (local) {
        m_pos1 = pos1;
        m_pos2 = pos2;
        m_dir1 = Vnorm(dir1);
        pos1_abs = Body1->TransformPointLocalToParent(m_pos1);
        pos2_abs = Body2->TransformPointLocalToParent(m_pos2);
        dir1_abs = Body1->TransformDirectionLocalToParent(m_dir1);
    } else {
        pos1_abs = pos1;
        pos2_abs = pos2;
        dir1_abs = Vnorm(dir1);
        m_pos1 = Body1->TransformPointParentToLocal(pos1_abs);
        m_pos2 = Body2->TransformPointParentToLocal(pos2_abs);
        m_dir1 = Body1->TransformDirectionParentToLocal(dir1_abs);
    }

    ChVector<> d12_abs = pos2_abs - pos1_abs;

    m_cur_dist = d12_abs.Length();
    m_dist = auto_distance ? m_cur_dist : distance;

    m_cur_dot = Vdot(d12_abs, dir1_abs);
}